

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::RepeatedPrimitiveFieldGenerator::
RepeatedPrimitiveFieldGenerator
          (RepeatedPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  ObjectiveCType OVar1;
  LogMessage *other;
  long *plVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  _func_void_FieldDescriptor_ptr *p_Var5;
  _func_void_FieldDescriptor_ptr *p_Var6;
  char *pcVar7;
  FieldDescriptor *pFVar8;
  string base_name;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  key_type local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  RepeatedFieldGenerator::RepeatedFieldGenerator
            (&this->super_RepeatedFieldGenerator,descriptor,options);
  (this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.super_SingleFieldGenerator.
  super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedPrimitiveFieldGenerator_00470878;
  variables = &(this->super_RepeatedFieldGenerator).super_ObjCObjFieldGenerator.
               super_SingleFieldGenerator.super_FieldGenerator.variables_;
  anon_unknown_5::SetPrimitiveVariables(descriptor,variables);
  if (*(once_flag **)(descriptor + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_88._0_8_ = descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,
               (FieldDescriptor **)local_88);
  }
  OVar1 = GetObjectiveCType(*(Type *)(descriptor + 0x38));
  if (OVar1 < (OBJECTIVECTYPE_MESSAGE|OBJECTIVECTYPE_UINT32)) {
    pcVar7 = &DAT_003dc6fc + *(int *)(&DAT_003dc6fc + (ulong)OVar1 * 4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/objectivec/objectivec_primitive_field.cc"
               ,0x72);
    other = internal::LogMessage::operator<<((LogMessage *)local_e0,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_88,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    pcVar7 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)&local_48,pcVar7,(allocator *)local_e0);
  if (local_48._M_string_length == 0) {
    p_Var5 = (_func_void_FieldDescriptor_ptr *)(local_e0 + 0x10);
    local_e0._0_8_ = p_Var5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"array_storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_e0);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3dc488);
    if ((_func_void_FieldDescriptor_ptr *)local_e0._0_8_ != p_Var5) {
      operator_delete((void *)local_e0._0_8_);
    }
    local_a8._0_8_ = (FieldDescriptor *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "NSMutableArray<",pmVar4);
    puVar3 = (undefined8 *)std::__cxx11::string::append(local_88);
    p_Var6 = (_func_void_FieldDescriptor_ptr *)(puVar3 + 2);
    if ((_func_void_FieldDescriptor_ptr *)*puVar3 == p_Var6) {
      local_d0[0]._0_8_ = *(undefined8 *)p_Var6;
      local_d0[0]._8_4_ = *(undefined4 *)(puVar3 + 3);
      local_d0[0]._12_4_ = *(undefined4 *)((long)puVar3 + 0x1c);
      local_e0._0_8_ = p_Var5;
    }
    else {
      local_d0[0]._0_8_ = *(undefined8 *)p_Var6;
      local_e0._0_8_ = (_func_void_FieldDescriptor_ptr *)*puVar3;
    }
    local_e0._8_8_ = puVar3[1];
    *puVar3 = p_Var6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"array_property_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_68);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((_func_void_FieldDescriptor_ptr *)local_e0._0_8_ != p_Var5) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((FieldDescriptor *)local_88._0_8_ != (FieldDescriptor *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    pFVar8 = (FieldDescriptor *)local_a8._0_8_;
    if ((FieldDescriptor *)local_a8._0_8_ == (FieldDescriptor *)(local_a8 + 0x10))
    goto LAB_002e9993;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "GPB",&local_48);
    plVar2 = (long *)std::__cxx11::string::append(local_88);
    p_Var5 = (_func_void_FieldDescriptor_ptr *)(plVar2 + 2);
    if ((_func_void_FieldDescriptor_ptr *)*plVar2 == p_Var5) {
      local_d0[0]._0_8_ = *(undefined8 *)p_Var5;
      local_d0[0]._8_4_ = (undefined4)plVar2[3];
      local_d0[0]._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
      local_e0._0_8_ = local_e0 + 0x10;
    }
    else {
      local_d0[0]._0_8_ = *(undefined8 *)p_Var5;
      local_e0._0_8_ = (_func_void_FieldDescriptor_ptr *)*plVar2;
    }
    local_e0._8_8_ = plVar2[1];
    *plVar2 = (long)p_Var5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_a8._0_8_ = (FieldDescriptor *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"array_storage_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)local_a8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_e0);
    if ((FieldDescriptor *)local_a8._0_8_ != (FieldDescriptor *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    pFVar8 = (FieldDescriptor *)local_88._0_8_;
    if ((FieldDescriptor *)local_88._0_8_ == (FieldDescriptor *)(local_88 + 0x10))
    goto LAB_002e9993;
  }
  operator_delete(pFVar8);
LAB_002e9993:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetPrimitiveVariables(descriptor, &variables_);

  string base_name = PrimitiveArrayTypeName(descriptor);
  if (base_name.length()) {
    variables_["array_storage_type"] = "GPB" + base_name + "Array";
  } else {
    variables_["array_storage_type"] = "NSMutableArray";
    variables_["array_property_type"] =
        "NSMutableArray<" + variables_["storage_type"] + "*>";
  }
}